

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void wave_morale_flag(tgestate_t *state)

{
  gametime_t *pgVar1;
  tgestate_t *in_RDI;
  uint8_t *flag_bitmap;
  uint8_t *scanline;
  uint8_t *pdisplayed_morale;
  uint8_t morale;
  uint8_t *pgame_counter;
  uint8_t in_stack_ffffffffffffffce;
  uint8_t in_stack_ffffffffffffffcf;
  uint8_t *dst;
  uint8_t *in_stack_ffffffffffffffd8;
  tgestate_t *state_00;
  
  pgVar1 = &in_RDI->game_counter;
  *pgVar1 = *pgVar1 + '\x01';
  if ((*pgVar1 & 1) == 0) {
    state_00 = (tgestate_t *)&in_RDI->displayed_morale;
    if (in_RDI->morale != *(byte *)state_00) {
      if (in_RDI->morale < *(byte *)state_00) {
        *(uint8_t *)state_00 = *(uint8_t *)state_00 + 0xff;
        in_stack_ffffffffffffffd8 = get_next_scanline(in_RDI,in_RDI->moraleflag_screen_address);
      }
      else {
        *(uint8_t *)state_00 = *(uint8_t *)state_00 + '\x01';
        in_stack_ffffffffffffffd8 = get_prev_scanline(in_RDI,in_RDI->moraleflag_screen_address);
      }
      in_RDI->moraleflag_screen_address = in_stack_ffffffffffffffd8;
    }
    dst = "";
    if ((*pgVar1 & 2) != 0) {
      dst = "";
    }
    plot_bitmap(state_00,in_stack_ffffffffffffffd8,dst,in_stack_ffffffffffffffcf,
                in_stack_ffffffffffffffce);
  }
  return;
}

Assistant:

void wave_morale_flag(tgestate_t *state)
{
  uint8_t       *pgame_counter;     /* was HL */
  uint8_t        morale;            /* was A */
  uint8_t       *pdisplayed_morale; /* was HL */
  uint8_t       *scanline;          /* was HL */
  const uint8_t *flag_bitmap;       /* was DE */

  assert(state != NULL);

  pgame_counter = &state->game_counter;
  (*pgame_counter)++;

  /* Wave the flag on every other turn. */
  if (*pgame_counter & 1)
    return;

  morale = state->morale;
  pdisplayed_morale = &state->displayed_morale;
  if (morale != *pdisplayed_morale)
  {
    if (morale < *pdisplayed_morale)
    {
      /* Decreasing morale. */
      (*pdisplayed_morale)--;
      scanline = get_next_scanline(state, state->moraleflag_screen_address);
    }
    else
    {
      /* Increasing morale. */
      (*pdisplayed_morale)++;
      scanline = get_prev_scanline(state, state->moraleflag_screen_address);
    }
    state->moraleflag_screen_address = scanline;
  }

  flag_bitmap = &flag_down[0];
  if (*pgame_counter & 2)
    flag_bitmap = &flag_up[0];
  plot_bitmap(state,
              flag_bitmap,
              state->moraleflag_screen_address,
              3, 25);
}